

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateLeaOfOOPData
          (Lowerer *this,RegOpnd *regOpnd,void *address,int32 offset,Instr *instrInsert)

{
  Func *func;
  uint left;
  StackSym *sym;
  RegOpnd *baseOpnd;
  char16 *desc;
  IndirOpnd *src;
  int32 local_3c;
  RegOpnd *pRStack_38;
  int32 dataOffset;
  
  func = instrInsert->m_func;
  pRStack_38 = regOpnd;
  left = NativeCodeData::GetDataTotalOffset(address);
  Int32Math::Add(left,offset,&local_3c);
  sym = Func::GetNativeCodeDataSym(func->topFunc);
  baseOpnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
  desc = NativeCodeData::GetDataDescription(address,func->m_alloc);
  src = IR::IndirOpnd::New(baseOpnd,local_3c,TyUint64,desc,func,true);
  InsertLea(pRStack_38,&src->super_Opnd,instrInsert);
  return;
}

Assistant:

void
Lowerer::GenerateLeaOfOOPData(IR::RegOpnd * regOpnd, void * address, int32 offset, IR::Instr * instrInsert)
{
    Func * func = instrInsert->m_func;
    int32 dataOffset;
    Int32Math::Add(NativeCodeData::GetDataTotalOffset(address), offset, &dataOffset);
    InsertLea(regOpnd,
              IR::IndirOpnd::New(IR::RegOpnd::New(func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), dataOffset, TyMachPtr,
#if DBG
                                 NativeCodeData::GetDataDescription(address, func->m_alloc),
#endif
                                 func, true),
              instrInsert);
}